

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Cluster::DoWriteFrame(Cluster *this,Frame *frame)

{
  bool bVar1;
  uint64 uVar2;
  uint64_t uVar3;
  mapped_type *pmVar4;
  Cluster *in_RSI;
  Frame *in_RDI;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *unaff_retaddr;
  uint64_t element_size;
  Cluster *in_stack_ffffffffffffffb8;
  Cluster *in_stack_ffffffffffffffc0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if ((in_RSI == (Cluster *)0x0) ||
     (bVar1 = Frame::IsValid((Frame *)in_stack_ffffffffffffffb8), !bVar1)) {
    return false;
  }
  bVar1 = PreWriteBlock(in_stack_ffffffffffffffb8);
  if (!bVar1) {
    return false;
  }
  uVar2 = WriteFrame((IMkvWriter *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     in_RDI,in_RSI);
  if (uVar2 == 0) {
    return false;
  }
  PostWriteBlock(in_stack_ffffffffffffffc0,(uint64_t)in_stack_ffffffffffffffb8);
  uVar3 = Frame::timestamp((Frame *)in_RSI);
  Frame::track_number((Frame *)in_RSI);
  pmVar4 = std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::operator[](unaff_retaddr,
                        (key_type *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  *pmVar4 = uVar3;
  return true;
}

Assistant:

bool Cluster::DoWriteFrame(const Frame* const frame) {
  if (!frame || !frame->IsValid())
    return false;

  if (!PreWriteBlock())
    return false;

  const uint64_t element_size = WriteFrame(writer_, frame, this);
  if (element_size == 0)
    return false;

  PostWriteBlock(element_size);
  last_block_timestamp_[frame->track_number()] = frame->timestamp();
  return true;
}